

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.cpp
# Opt level: O0

char * __thiscall CppUnit::Exception::what(Exception *this)

{
  string *__lhs;
  char *pcVar1;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Exception *local_18;
  Exception *mutableThis;
  Exception *this_local;
  
  local_18 = this;
  mutableThis = this;
  __lhs = Message::shortDescription_abi_cxx11_(&this->m_message);
  std::operator+(&local_58,__lhs,"\n");
  Message::details_abi_cxx11_(&local_78,&this->m_message);
  std::operator+(&local_38,&local_58,&local_78);
  std::__cxx11::string::operator=((string *)&local_18->m_whatMessage,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  return pcVar1;
}

Assistant:

const char*
Exception::what() const throw()
{
  Exception *mutableThis = CPPUNIT_CONST_CAST( Exception *, this );
  mutableThis->m_whatMessage = m_message.shortDescription() + "\n" + 
                               m_message.details();
  return m_whatMessage.c_str();
}